

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

apx_error_t apx_file_write_notify(apx_file_t *self,uint32_t offset,uint8_t *src,uint32_t len)

{
  uint32_t len_local;
  uint8_t *src_local;
  uint32_t offset_local;
  apx_file_t *self_local;
  
  if (self == (apx_file_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else {
    apx_file_lock(self);
    if ((self->has_first_write & 1U) == 0) {
      self->has_first_write = true;
    }
    apx_file_unlock(self);
    if ((self->notification_handler).write_notify == (apx_file_write_notify_func *)0x0) {
      self_local._4_4_ = 0x34;
    }
    else {
      self_local._4_4_ =
           (*(self->notification_handler).write_notify)
                     ((self->notification_handler).arg,self,offset,src,len);
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_file_write_notify(apx_file_t* self, uint32_t offset, const uint8_t* src, uint32_t len)
{
   if (self != 0)
   {
      apx_file_lock(self);
      if (!self->has_first_write)
      {
         self->has_first_write = true;
      }
      apx_file_unlock(self);
      if (self->notification_handler.write_notify != 0)
      {
         return self->notification_handler.write_notify(self->notification_handler.arg, self, offset, src, len);
      }
      return APX_INVALID_WRITE_HANDLER_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}